

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stoch.c
# Opt level: O2

TA_RetCode
rangeTestFunction(TA_Integer startIdx,TA_Integer endIdx,TA_Real *outputBuffer,
                 TA_Integer *outputBufferInt,TA_Integer *outBegIdx,TA_Integer *outNbElement,
                 TA_Integer *lookback,void *opaqueData,uint outputNb,uint *isOutputInteger)

{
  int *piVar1;
  long lVar2;
  TA_RetCode TVar3;
  int iVar4;
  double *__ptr;
  double *pdVar5;
  TA_Real *pTVar6;
  
  *isOutputInteger = 0;
  __ptr = (double *)malloc((long)((endIdx - startIdx) + 1) << 3);
  piVar1 = *opaqueData;
  iVar4 = *piVar1;
  if (iVar4 == 2) {
    pdVar5 = outputBuffer;
    pTVar6 = __ptr;
    if (outputNb != 0) {
      pdVar5 = __ptr;
      pTVar6 = outputBuffer;
    }
    TVar3 = TA_STOCHRSI(startIdx,endIdx,*(double **)((long)opaqueData + 0x18),piVar1[5],piVar1[6],
                        piVar1[8],piVar1[9],outBegIdx,outNbElement,pdVar5,pTVar6);
    lVar2 = *opaqueData;
    iVar4 = TA_STOCHRSI_Lookback
                      (*(int *)(lVar2 + 0x14),*(int *)(lVar2 + 0x18),*(int *)(lVar2 + 0x20),
                       *(TA_MAType *)(lVar2 + 0x24));
  }
  else if (iVar4 == 1) {
    pdVar5 = outputBuffer;
    pTVar6 = __ptr;
    if (outputNb != 0) {
      pdVar5 = __ptr;
      pTVar6 = outputBuffer;
    }
    TVar3 = TA_STOCHF(startIdx,endIdx,*(double **)((long)opaqueData + 8),
                      *(double **)((long)opaqueData + 0x10),*(double **)((long)opaqueData + 0x18),
                      piVar1[5],piVar1[6],piVar1[7],outBegIdx,outNbElement,pdVar5,pTVar6);
    lVar2 = *opaqueData;
    iVar4 = TA_STOCHF_Lookback(*(int *)(lVar2 + 0x14),*(int *)(lVar2 + 0x18),
                               *(TA_MAType *)(lVar2 + 0x1c));
  }
  else {
    if (iVar4 != 0) {
      TVar3 = TA_NOT_SUPPORTED;
      goto LAB_0011bcc7;
    }
    pdVar5 = outputBuffer;
    pTVar6 = __ptr;
    if (outputNb != 0) {
      pdVar5 = __ptr;
      pTVar6 = outputBuffer;
    }
    TVar3 = TA_STOCH(startIdx,endIdx,*(double **)((long)opaqueData + 8),
                     *(double **)((long)opaqueData + 0x10),*(double **)((long)opaqueData + 0x18),
                     piVar1[5],piVar1[6],piVar1[7],piVar1[8],piVar1[9],outBegIdx,outNbElement,pdVar5
                     ,pTVar6);
    lVar2 = *opaqueData;
    iVar4 = TA_STOCH_Lookback(*(int *)(lVar2 + 0x14),*(int *)(lVar2 + 0x18),
                              *(TA_MAType *)(lVar2 + 0x1c),*(int *)(lVar2 + 0x20),
                              *(TA_MAType *)(lVar2 + 0x24));
  }
  *lookback = iVar4;
LAB_0011bcc7:
  free(__ptr);
  return TVar3;
}

Assistant:

static TA_RetCode rangeTestFunction( TA_Integer   startIdx,
                                     TA_Integer    endIdx,
                                     TA_Real      *outputBuffer,
                                     TA_Integer   *outputBufferInt,
                                     TA_Integer   *outBegIdx,
                                     TA_Integer   *outNbElement,
                                     TA_Integer   *lookback,
                                     void         *opaqueData,
                                     unsigned int  outputNb,
                                     unsigned int *isOutputInteger )
{
  TA_RetCode retCode;
  TA_RangeTestParam *testParam;
  TA_Real *dummyOutput;

  (void)outputBufferInt;

  *isOutputInteger = 0;

  retCode = TA_NOT_SUPPORTED;

  testParam = (TA_RangeTestParam *)opaqueData;


  dummyOutput = TA_Malloc( (endIdx-startIdx+1) * sizeof(TA_Real) );

  switch( testParam->test->testId )
  {
  case TEST_STOCH:
     if( outputNb == 0 )
     {
        retCode = TA_STOCH( startIdx,
                            endIdx,
                            testParam->high,
                            testParam->low,
                            testParam->close,
                            testParam->test->optInPeriod_0,
                            testParam->test->optInPeriod_1,
                            (TA_MAType)testParam->test->optInMAType_1,
                            testParam->test->optInPeriod_2,
                            (TA_MAType)testParam->test->optInMAType_2,
                            outBegIdx, outNbElement,
                            outputBuffer,
                            dummyOutput );

      }
      else
      {
        retCode = TA_STOCH( startIdx,
                            endIdx,
                            testParam->high,
                            testParam->low,
                            testParam->close,
                            testParam->test->optInPeriod_0,
                            testParam->test->optInPeriod_1,
                            (TA_MAType)testParam->test->optInMAType_1,
                            testParam->test->optInPeriod_2,
                            (TA_MAType)testParam->test->optInMAType_2,
                            outBegIdx, outNbElement,
                            dummyOutput,
                            outputBuffer );
      }

      *lookback = TA_STOCH_Lookback( testParam->test->optInPeriod_0,
                            testParam->test->optInPeriod_1,
                            (TA_MAType)testParam->test->optInMAType_1,
                            testParam->test->optInPeriod_2,
                            (TA_MAType)testParam->test->optInMAType_2 );
      break;
  case TEST_STOCHF:
     if( outputNb == 0 )
     {
        retCode = TA_STOCHF( startIdx,
                             endIdx,
                             testParam->high,
                             testParam->low,
                             testParam->close,
                             testParam->test->optInPeriod_0,
                             testParam->test->optInPeriod_1,
                             (TA_MAType)testParam->test->optInMAType_1,
                             outBegIdx, outNbElement,
                             outputBuffer,
                             dummyOutput );

      }
      else
      {
        retCode = TA_STOCHF( startIdx,
                             endIdx,
                             testParam->high,
                             testParam->low,
                             testParam->close,
                             testParam->test->optInPeriod_0,
                             testParam->test->optInPeriod_1,
                             (TA_MAType)testParam->test->optInMAType_1,
                             outBegIdx, outNbElement,
                             dummyOutput,
                             outputBuffer );
      }

      *lookback = TA_STOCHF_Lookback( testParam->test->optInPeriod_0,
                             testParam->test->optInPeriod_1,
                             (TA_MAType)testParam->test->optInMAType_1 );
      break;

   case TEST_STOCHRSI:
     if( outputNb == 0 )
     {
        retCode = TA_STOCHRSI( startIdx,
                            endIdx,
                            testParam->close,
                            testParam->test->optInPeriod_0,
                            testParam->test->optInPeriod_1,
                            testParam->test->optInPeriod_2,
                            (TA_MAType)testParam->test->optInMAType_2,
                            outBegIdx, outNbElement,
                            outputBuffer,
                            dummyOutput );

      }
      else
      {
        retCode = TA_STOCHRSI( startIdx,
                            endIdx,
                            testParam->close,
                            testParam->test->optInPeriod_0,
                            testParam->test->optInPeriod_1,
                            testParam->test->optInPeriod_2,
                            (TA_MAType)testParam->test->optInMAType_2,
                            outBegIdx, outNbElement,
                            dummyOutput,
                            outputBuffer );
      }

      *lookback = TA_STOCHRSI_Lookback( testParam->test->optInPeriod_0,
                            testParam->test->optInPeriod_1,
                            testParam->test->optInPeriod_2,
                            (TA_MAType)testParam->test->optInMAType_2 );
      break;
   }

   TA_Free( dummyOutput );

   return retCode;
}